

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringSubstrMethod::~StringSubstrMethod(StringSubstrMethod *this)

{
  StringSubstrMethod *this_local;
  
  ~StringSubstrMethod(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringSubstrMethod(Compilation& comp) :
        SimpleSystemSubroutine("substr", SubroutineKind::Function, 2,
                               {&comp.getIntType(), &comp.getIntType()}, comp.getStringType(),
                               true) {}